

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O2

either * toml::detail::syntax::literal_char(either *__return_storage_ptr__,spec *s)

{
  non_ascii local_80;
  character_in_range local_58;
  character_in_range local_48;
  character local_38;
  
  local_38.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004e8900;
  local_38.value_ = '\t';
  local_48.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004e89c0;
  local_48.from_ = ' ';
  local_48.to_ = '&';
  local_58.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004e89c0;
  local_58.from_ = '(';
  local_58.to_ = '~';
  non_ascii::non_ascii(&local_80,s);
  either::
  either<toml::detail::character,toml::detail::character_in_range,toml::detail::character_in_range,toml::detail::syntax::non_ascii>
            (__return_storage_ptr__,&local_38,&local_48,&local_58,&local_80);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_80.scanner_.others_);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE either literal_char(const spec& s)
{
    return either(
            character         (0x09),
            character_in_range(0x20, 0x26),
            character_in_range(0x28, 0x7E),
            non_ascii(s)
        );
}